

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::InvocationCountShader::shadePrimitives
          (InvocationCountShader *this,GeometryEmitter *output,int verticesIn,
          PrimitivePacket *packets,int numPackets,int invocationID)

{
  PrimitivePacket *pPVar1;
  VertexPacket *pVVar2;
  GeometryEmitter *pGVar3;
  Vec4 *a;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float local_10c;
  Vector<float,_4> local_108;
  GeometryEmitter *local_f0;
  Vec4 position1;
  Vec4 position2;
  Vec4 position0;
  Vector<float,_4> local_78;
  Vector<float,_4> local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  anon_union_16_3_1194ccdc_for_v local_48;
  
  local_10c = 1.0;
  if (((long)invocationID / 2 & 1U) != 0) {
    local_10c = 0.0;
  }
  uVar6 = invocationID + 3;
  uVar7 = 0;
  local_f0 = output;
  uVar5 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    uVar5 = uVar7;
  }
  for (; uVar7 != uVar5; uVar7 = uVar7 + 1) {
    fVar8 = ((float)invocationID / (float)*(int *)&(this->super_ShaderProgram).field_0x154) * 5.5;
    pPVar1 = packets + uVar7;
    pVVar2 = packets[uVar7].vertices[0];
    if (this->m_testCase == CASE_DIFFERENT_OUTPUT_COUNTS) {
      fVar9 = cosf(fVar8);
      fVar8 = sinf(fVar8);
      position1.m_data[0] = fVar9 * 0.6;
      position1.m_data[1] = fVar8 * 0.6;
      position1.m_data[2] = 0.0;
      position1.m_data[3] = 0.0;
      tcu::operator+((tcu *)&position0,&pVVar2->position,&position1);
      position1.m_data[1] = local_10c;
      position1.m_data[0] = (float)(invocationID + (int)((long)invocationID / 2) * -2);
      position1.m_data[2] = 1.0;
      position1.m_data[3] = 1.0;
      for (iVar4 = 1; iVar4 < (int)uVar6; iVar4 = iVar4 + 2) {
        fVar8 = (((float)(iVar4 + -1) + 1.0) / (float)(int)uVar6) * 3.141;
        fVar9 = cosf(fVar8);
        fVar10 = sinf(fVar8);
        local_108.m_data[1] = fVar10 * 0.1;
        local_108.m_data[0] = fVar9 * 0.1;
        local_108.m_data[2] = 0.0;
        local_108.m_data[3] = 0.0;
        tcu::operator+((tcu *)&position2,&position0,&local_108);
        pGVar3 = local_f0;
        rr::GeometryEmitter::EmitVertex
                  (local_f0,&position2,0.0,(GenericVec4 *)&position1,pPVar1->primitiveIDIn);
        fVar9 = cosf(fVar8);
        fVar8 = sinf(fVar8);
        local_108.m_data[1] = fVar8 * -0.1;
        local_108.m_data[0] = fVar9 * 0.1;
        local_108.m_data[2] = 0.0;
        local_108.m_data[3] = 0.0;
        tcu::operator+((tcu *)&position2,&position0,&local_108);
        rr::GeometryEmitter::EmitVertex
                  (pGVar3,&position2,0.0,(GenericVec4 *)&position1,pPVar1->primitiveIDIn);
      }
      if ((uVar6 & 0x80000001) == 1) {
        local_108.m_data._0_12_ = ZEXT812(0xbdcccccd);
        local_108.m_data[3] = 0.0;
        tcu::operator+((tcu *)&position2,&position0,&local_108);
        rr::GeometryEmitter::EmitVertex
                  (local_f0,&position2,0.0,(GenericVec4 *)&position1,pPVar1->primitiveIDIn);
      }
      rr::GeometryEmitter::EndPrimitive(local_f0);
    }
    else if (this->m_testCase == CASE_FIXED_OUTPUT_COUNTS) {
      a = &pVVar2->position;
      fVar9 = cosf(fVar8);
      fVar10 = sinf(fVar8);
      position1.m_data[0] = fVar9 * 0.5;
      position1.m_data[1] = fVar10 * 0.5;
      position1.m_data[2] = 0.0;
      position1.m_data[3] = 0.0;
      tcu::operator+((tcu *)&position0,a,(Vector<float,_4> *)&position1);
      fVar9 = cosf(fVar8 + 0.1);
      fVar10 = sinf(fVar8 + 0.1);
      position2.m_data[0] = fVar9 * 0.6;
      position2.m_data[1] = fVar10 * 0.6;
      position2.m_data[2] = 0.0;
      position2.m_data[3] = 0.0;
      tcu::operator+((tcu *)&position1,a,(Vector<float,_4> *)&position2);
      fVar9 = cosf(fVar8 + -0.1);
      fVar8 = sinf(fVar8 + -0.1);
      local_108.m_data[1] = fVar8 * 0.6;
      local_108.m_data[0] = fVar9 * 0.6;
      local_108.m_data[2] = 0.0;
      local_108.m_data[3] = 0.0;
      tcu::operator+((tcu *)&position2,a,&local_108);
      local_108.m_data[0] = 0.0;
      local_108.m_data[1] = 0.0;
      local_108.m_data[2] = 0.0;
      local_108.m_data[3] = 0.0;
      local_48 = (anon_union_16_3_1194ccdc_for_v)0x0;
      local_68.m_data[0] = 1.0;
      local_68.m_data[1] = 1.0;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 1.0;
      local_78.m_data._0_8_ = *(undefined8 *)&pPVar1->vertices[0]->outputs[0].v;
      local_78.m_data._8_8_ = *(undefined8 *)((long)&pPVar1->vertices[0]->outputs[0].v + 8);
      tcu::operator*((tcu *)&local_58,&local_68,&local_78);
      local_108.m_data[2] = (float)(undefined4)uStack_50;
      local_108.m_data[3] = (float)uStack_50._4_4_;
      local_108.m_data[0] = (float)(undefined4)local_58;
      local_108.m_data[1] = (float)local_58._4_4_;
      local_68.m_data[0] = 1.0;
      local_68.m_data[1] = 0.0;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 1.0;
      local_78.m_data._0_8_ = *(undefined8 *)&pPVar1->vertices[0]->outputs[0].v;
      local_78.m_data._8_8_ = *(undefined8 *)((long)&pPVar1->vertices[0]->outputs[0].v + 8);
      tcu::operator*((tcu *)&local_58,&local_68,&local_78);
      pGVar3 = local_f0;
      rr::GeometryEmitter::EmitVertex
                (local_f0,&position0,0.0,(GenericVec4 *)&local_108,pPVar1->primitiveIDIn);
      rr::GeometryEmitter::EmitVertex
                (pGVar3,&position1,0.0,(GenericVec4 *)&local_48,pPVar1->primitiveIDIn);
      rr::GeometryEmitter::EmitVertex
                (pGVar3,&position2,0.0,(GenericVec4 *)&local_48,pPVar1->primitiveIDIn);
      rr::GeometryEmitter::EndPrimitive(pGVar3);
    }
  }
  return;
}

Assistant:

void InvocationCountShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(verticesIn);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const float				l_angle		= float(invocationID) / float(m_numInvocations) * 5.5f;
		const float				l_radius	= 0.6f;

		const rr::VertexPacket*	vertex		= packets[packetNdx].vertices[0];

		if (m_testCase == CASE_FIXED_OUTPUT_COUNTS)
		{
			const tcu::Vec4			position0	= vertex->position + tcu::Vec4(deFloatCos(l_angle)      * (l_radius - 0.1f), deFloatSin(l_angle)      * (l_radius - 0.1f), 0.0f, 0.0f);
			const tcu::Vec4			position1	= vertex->position + tcu::Vec4(deFloatCos(l_angle+0.1f) * l_radius,          deFloatSin(l_angle+0.1f) * l_radius,          0.0f, 0.0f);
			const tcu::Vec4			position2	= vertex->position + tcu::Vec4(deFloatCos(l_angle-0.1f) * l_radius,          deFloatSin(l_angle-0.1f) * l_radius,          0.0f, 0.0f);

			rr::GenericVec4			tipColor;
			rr::GenericVec4			baseColor;

			tipColor  = tcu::Vec4(1.0, 1.0, 0.0, 1.0) * packets[packetNdx].vertices[0]->outputs[0].get<float>();
			baseColor = tcu::Vec4(1.0, 0.0, 0.0, 1.0) * packets[packetNdx].vertices[0]->outputs[0].get<float>();

			output.EmitVertex(position0, 0.0f, &tipColor, packets[packetNdx].primitiveIDIn);
			output.EmitVertex(position1, 0.0f, &baseColor, packets[packetNdx].primitiveIDIn);
			output.EmitVertex(position2, 0.0f, &baseColor, packets[packetNdx].primitiveIDIn);
			output.EndPrimitive();
		}
		else if (m_testCase == CASE_DIFFERENT_OUTPUT_COUNTS)
		{
			const tcu::Vec4 color			= tcu::Vec4(float(invocationID % 2), (((invocationID / 2) % 2) == 0) ? (1.0f) : (0.0f), 1.0f, 1.0f);
			const tcu::Vec4 basePosition	= vertex->position + tcu::Vec4(deFloatCos(l_angle) * l_radius, deFloatSin(l_angle) * l_radius, 0.0f, 0.0f);
			const int		numNgonVtx		= invocationID + 3;

			rr::GenericVec4	outColor;
			outColor = color;

			for (int ndx = 0; ndx + 1 < numNgonVtx; ndx += 2)
			{
				const float subAngle = (float(ndx) + 1.0f) / float(numNgonVtx) * 3.141f;

				output.EmitVertex(basePosition + tcu::Vec4(deFloatCos(subAngle) * 0.1f, deFloatSin(subAngle) *  0.1f, 0.0f, 0.0f), 0.0f, &outColor, packets[packetNdx].primitiveIDIn);
				output.EmitVertex(basePosition + tcu::Vec4(deFloatCos(subAngle) * 0.1f, deFloatSin(subAngle) * -0.1f, 0.0f, 0.0f), 0.0f, &outColor, packets[packetNdx].primitiveIDIn);
			}

			if ((numNgonVtx % 2) == 1)
				output.EmitVertex(basePosition + tcu::Vec4(-0.1f, 0.0f, 0.0f, 0.0f), 0.0f, &outColor, packets[packetNdx].primitiveIDIn);

			output.EndPrimitive();
		}
	}
}